

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

int __thiscall QWizard::addPage(QWizard *this,QWizardPage *page)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  int theid;
  
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  lVar2 = *(long *)(lVar1 + 0x2e0);
  theid = 0;
  if ((lVar2 != 0) && (theid = 0, *(long *)(lVar2 + 0x30) != 0)) {
    piVar3 = QMap<int,_QWizardPage_*>::lastKey((QMap<int,_QWizardPage_*> *)(lVar1 + 0x2e0));
    theid = *piVar3 + 1;
  }
  setPage(this,theid,page);
  return theid;
}

Assistant:

int QWizard::addPage(QWizardPage *page)
{
    Q_D(QWizard);
    int theid = 0;
    if (!d->pageMap.isEmpty())
        theid = d->pageMap.lastKey() + 1;
    setPage(theid, page);
    return theid;
}